

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalGenerator.cxx
# Opt level: O2

void __thiscall
cmLocalGenerator::AddCMP0018Flags
          (cmLocalGenerator *this,string *flags,cmTarget *target,string *lang,string *config)

{
  TargetType targetType;
  bool bVar1;
  TargetType TVar2;
  allocator local_59;
  string *local_58;
  string local_50;
  
  targetType = target->TargetTypeValue;
  TVar2 = targetType & ~STATIC_LIBRARY;
  local_58 = config;
  bVar1 = GetShouldUseOldFlags(this,TVar2 == SHARED_LIBRARY,lang);
  if (bVar1) {
    AddSharedFlags(this,flags,lang,TVar2 == SHARED_LIBRARY);
    return;
  }
  if (target->TargetTypeValue == OBJECT_LIBRARY) {
    std::__cxx11::string::string((string *)&local_50,"POSITION_INDEPENDENT_CODE",&local_59);
    bVar1 = cmTarget::GetPropertyAsBool(target,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      AddPositionIndependentFlags(this,flags,lang,targetType);
    }
  }
  else {
    std::__cxx11::string::string((string *)&local_50,"POSITION_INDEPENDENT_CODE",&local_59);
    bVar1 = cmTarget::GetLinkInterfaceDependentBoolProperty(target,&local_50,local_58);
    std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      AddPositionIndependentFlags(this,flags,lang,targetType);
    }
    if (TVar2 == SHARED_LIBRARY) {
      AppendFeatureOptions(this,flags,lang,"DLL");
    }
  }
  return;
}

Assistant:

void cmLocalGenerator::AddCMP0018Flags(std::string &flags,
                                       cmTarget const* target,
                                       std::string const& lang,
                                       const std::string& config)
{
  int targetType = target->GetType();

  bool shared = ((targetType == cmTarget::SHARED_LIBRARY) ||
                  (targetType == cmTarget::MODULE_LIBRARY));

  if (this->GetShouldUseOldFlags(shared, lang))
    {
    this->AddSharedFlags(flags, lang, shared);
    }
  else
    {
    if (target->GetType() == cmTarget::OBJECT_LIBRARY)
      {
      if (target->GetPropertyAsBool("POSITION_INDEPENDENT_CODE"))
        {
        this->AddPositionIndependentFlags(flags, lang, targetType);
        }
      return;
      }

    if (target->GetLinkInterfaceDependentBoolProperty(
                                                "POSITION_INDEPENDENT_CODE",
                                                config))
      {
      this->AddPositionIndependentFlags(flags, lang, targetType);
      }
    if (shared)
      {
      this->AppendFeatureOptions(flags, lang, "DLL");
      }
    }
}